

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::getp_parseQuery
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t obj;
  vm_httpreq_ext *pvVar2;
  char *__s;
  CVmObjLookupTable *tab_00;
  CVmObject *pCVar3;
  char *str;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  char *qq;
  CVmObjLookupTable *tab;
  size_t ql;
  char *q;
  TadsHttpRequest *req;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  uint *in_stack_ffffffffffffff90;
  vm_val_t *this_00;
  int encmode;
  TadsHttpRequest *pTVar4;
  int encmode_00;
  char *in_stack_ffffffffffffffc8;
  CVmObjLookupTable *in_stack_ffffffffffffffd0;
  
  if ((getp_parseQuery(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_parseQuery(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_parseQuery::desc,0);
    __cxa_guard_release(&getp_parseQuery(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_RDI,in_stack_ffffffffffffff90,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (iVar1 == 0) {
    pvVar2 = get_ext((CVmObjHTTPRequest *)in_RDI);
    pTVar4 = pvVar2->req;
    __s = StringRef::get(pTVar4->resource_name);
    encmode_00 = (int)((ulong)pTVar4 >> 0x20);
    tab_00 = (CVmObjLookupTable *)strlen(__s);
    this_00 = in_RDX;
    obj = CVmObjLookupTable::create
                    ((int)((ulong)in_RDX >> 0x20),(uint)in_RDX,in_stack_ffffffffffffff8c);
    vm_val_t::set_obj(this_00,obj);
    encmode = (int)((ulong)this_00 >> 0x20);
    CVmStack::push(in_RDX);
    pCVar3 = vm_objp(0);
    iVar1 = (int)((ulong)pCVar3 >> 0x20);
    str = strchr(__s,0x3f);
    if (str == (char *)0x0) {
      str = __s + (long)tab_00;
    }
    add_parsed_val(tab_00,iVar1,str,(size_t)in_RDI,encmode);
    if (*str == '?') {
      parse_query_params(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,encmode_00);
    }
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_parseQuery(VMG_ vm_obj_id_t self,
                                       vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the query string from the request */
    TadsHttpRequest *req = get_ext()->req;
    const char *q = req->resource_name->get();
    size_t ql = strlen(q);

    /* create a lookup table to hold the result; push it for gc protection */
    retval->set_obj(CVmObjLookupTable::create(vmg_ FALSE, 16, 32));
    G_stk->push(retval);
    CVmObjLookupTable *tab =
        (CVmObjLookupTable *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   the resource name is the part of the query up to the first '?', or
     *   the entire string if there's no '?' 
     */
    const char *qq = strchr(q, '?');
    if (qq == 0)
        qq = q + ql;

    /* add the resource name under key [1] */
    add_parsed_val(vmg_ tab, 1, q, qq - q, ENCMODE_URL);

    /* parse the query parameters, starting after the '?' */
    if (*qq == '?')
        parse_query_params(vmg_ tab, qq + 1, ENCMODE_URL);

    /* done with the gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}